

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  TidyTagId TVar2;
  ulong uVar3;
  Dict *pDVar4;
  Node *pNVar5;
  Bool BVar6;
  int iVar7;
  uint uVar8;
  Node *pNVar9;
  AttVal *pAVar10;
  Node **ppNVar11;
  Node *pNVar12;
  Stack *stack;
  TidyDocImpl *node;
  Node *pNVar13;
  TidyDocImpl *node_00;
  
  pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar9 != (Node *)0x0) {
    pNVar12 = (Node *)0x0;
LAB_0013f176:
    do {
      pNVar13 = pNVar9;
      if (pNVar13->type == XmlDecl) {
        doc->xmlDetected = yes;
        pNVar9 = prvTidyFindXmlDecl(doc);
        if ((pNVar9 == (Node *)0x0) || ((doc->root).content == (Node *)0x0)) {
          if ((1 < pNVar13->line) || (pNVar13->column != 1)) {
            prvTidyReport(doc,&doc->root,pNVar13,0x275);
          }
          goto LAB_0013f1be;
        }
LAB_0013f1d6:
        prvTidyReport(doc,&doc->root,pNVar13,0x235);
        prvTidyFreeNode(doc,pNVar13);
      }
      else {
LAB_0013f1be:
        BVar6 = InsertMisc(&doc->root,pNVar13);
        if (BVar6 == no) {
          NVar1 = pNVar13->type;
          if (NVar1 == EndTag) goto LAB_0013f1d6;
          if (NVar1 == StartTag) {
            if ((((pNVar13->tag != (Dict *)0x0) && (pNVar13->tag->id == TidyTag_HTML)) &&
                (pAVar10 = prvTidyAttrGetById(pNVar13,TidyAttr_XMLNS), pAVar10 != (AttVal *)0x0)) &&
               ((pAVar10->value != (ctmbstr)0x0 &&
                (iVar7 = prvTidytmbstrcasecmp(pAVar10->value,"http://www.w3.org/1999/xhtml"),
                iVar7 == 0)))) {
              iVar7 = *(int *)((doc->config).value + 0x21);
              doc->lexer->isvoyager = yes;
              BVar6 = (Bool)(iVar7 == 0);
              prvTidySetOptionBool(doc,TidyXhtmlOut,BVar6);
              prvTidySetOptionBool(doc,TidyXmlOut,BVar6);
              if (iVar7 == 0) {
                prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
                prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
              }
            }
          }
          else if (NVar1 == DocTypeTag) {
            if (pNVar12 == (Node *)0x0) {
              pNVar13->parent = &doc->root;
              if (doc == (TidyDocImpl *)0x0) {
                pNVar13->prev = (Node *)0x0;
LAB_0013f275:
                if (doc == (TidyDocImpl *)0x0) goto LAB_0013f282;
                (doc->root).content = pNVar13;
              }
              else {
                pNVar9 = (doc->root).last;
                pNVar13->prev = pNVar9;
                if (pNVar9 == (Node *)0x0) goto LAB_0013f275;
                pNVar9->next = pNVar13;
                if (doc == (TidyDocImpl *)0x0) goto LAB_0013f282;
              }
              (doc->root).last = pNVar13;
            }
            else {
              prvTidyReport(doc,&doc->root,pNVar13,0x235);
              prvTidyFreeNode(doc,pNVar13);
              pNVar13 = pNVar12;
            }
LAB_0013f282:
            pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
            pNVar12 = pNVar13;
            if (pNVar9 == (Node *)0x0) break;
            goto LAB_0013f176;
          }
          if (((pNVar13->type != StartTag) || (pNVar13->tag == (Dict *)0x0)) ||
             (pNVar13->tag->id != TidyTag_HTML)) {
            prvTidyUngetToken(doc);
            pNVar13 = prvTidyInferredTag(doc,TidyTag_HTML);
          }
          pNVar9 = prvTidyFindDocType(doc);
          if (pNVar9 == (Node *)0x0) {
            uVar3 = (doc->config).value[0xe].v;
            if ((uVar3 != 1) && (*(int *)((doc->config).value + 6) != 1)) {
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
            }
            if ((uVar3 & 0xfffffffffffffffd) != 0) {
              prvTidyAdjustTags(doc);
            }
          }
          pNVar13->parent = &doc->root;
          if (doc == (TidyDocImpl *)0x0) {
            pNVar13->prev = (Node *)0x0;
LAB_0013f3d1:
            if (doc != (TidyDocImpl *)0x0) {
              ppNVar11 = &(doc->root).content;
              goto LAB_0013f3da;
            }
          }
          else {
            pNVar9 = (doc->root).last;
            pNVar13->prev = pNVar9;
            if (pNVar9 == (Node *)0x0) goto LAB_0013f3d1;
            ppNVar11 = &pNVar9->next;
LAB_0013f3da:
            *ppNVar11 = pNVar13;
            if (doc != (TidyDocImpl *)0x0) {
              (doc->root).last = pNVar13;
            }
          }
          ParseHTMLWithNode(doc,pNVar13);
          break;
        }
      }
      pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar9 != (Node *)0x0);
  }
  if ((doc->config).value[1].v != 0) {
    prvTidyAccessibilityChecks(doc);
  }
  pNVar9 = prvTidyFindHTML(doc);
  if (pNVar9 == (Node *)0x0) {
    pNVar9 = prvTidyInferredTag(doc,TidyTag_HTML);
    pNVar9->parent = &doc->root;
    if (doc == (TidyDocImpl *)0x0) {
      pNVar9->prev = (Node *)0x0;
LAB_0013f440:
      if (doc != (TidyDocImpl *)0x0) {
        ppNVar11 = &(doc->root).content;
        goto LAB_0013f449;
      }
    }
    else {
      pNVar12 = (doc->root).last;
      pNVar9->prev = pNVar12;
      if (pNVar12 == (Node *)0x0) goto LAB_0013f440;
      ppNVar11 = &pNVar12->next;
LAB_0013f449:
      *ppNVar11 = pNVar9;
      if (doc != (TidyDocImpl *)0x0) {
        (doc->root).last = pNVar9;
      }
    }
    ParseHTMLWithNode(doc,pNVar9);
  }
  pNVar9 = prvTidyFindTITLE(doc);
  if (pNVar9 != (Node *)0x0) {
    if (((pNVar9->content == (Node *)0x0) && (*(int *)((doc->config).value + 6) != 1)) &&
       (BVar6 = prvTidyIsHTML5Mode(doc), BVar6 != no)) {
      prvTidyReport(doc,pNVar9,(Node *)0x0,0x293);
    }
    goto LAB_0013f51b;
  }
  pNVar9 = prvTidyFindHEAD(doc);
  if (*(int *)((doc->config).value + 6) != 1) {
    prvTidyReport(doc,pNVar9,(Node *)0x0,0x262);
  }
  pNVar12 = prvTidyInferredTag(doc,TidyTag_TITLE);
  pNVar12->parent = pNVar9;
  if (pNVar9 == (Node *)0x0) {
    pNVar12->prev = (Node *)0x0;
LAB_0013f506:
    if (pNVar9 == (Node *)0x0) goto LAB_0013f51b;
    ppNVar11 = &pNVar9->content;
  }
  else {
    pNVar13 = pNVar9->last;
    pNVar12->prev = pNVar13;
    if (pNVar13 == (Node *)0x0) goto LAB_0013f506;
    ppNVar11 = &pNVar13->next;
  }
  *ppNVar11 = pNVar12;
  if (pNVar9 != (Node *)0x0) {
    pNVar9->last = pNVar12;
  }
LAB_0013f51b:
  AttributeChecks(doc,&doc->root);
  ReplaceObsoleteElements(doc,&doc->root);
  prvTidyDropEmptyElements(doc,&doc->root);
  stack = prvTidynewStack(doc,0x10);
  node_00 = doc;
  if (doc != (TidyDocImpl *)0x0) {
    do {
      node = (TidyDocImpl *)(node_00->root).next;
      BVar6 = prvTidynodeIsText(&node_00->root);
      if (((BVar6 != no) && (BVar6 = prvTidynodeIsText(&node_00->root), BVar6 != no)) &&
         (pNVar9 = (node_00->root).parent, pNVar12 = pNVar9, pNVar9->type != DocTypeTag)) {
        for (; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->parent) {
          if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->parser == prvTidyParsePre))
          goto LAB_0013f58a;
        }
        if ((pNVar9->tag == (Dict *)0x0) || (pNVar9->tag->parser != prvTidyParseScript)) {
          pNVar12 = (node_00->root).prev;
          if (pNVar12 == (Node *)0x0) {
            BVar6 = prvTidynodeHasCM(pNVar9,0x10);
            if (BVar6 != no) goto LAB_0013f761;
          }
          else if ((pNVar12->tag == (Dict *)0x0) ||
                  ((TVar2 = pNVar12->tag->id, TVar2 != TidyTag_BR &&
                   ((((TVar2 != TidyTag_SCRIPT || (pNVar12->parent == (Node *)0x0)) ||
                     (pDVar4 = pNVar12->parent->tag, pDVar4 == (Dict *)0x0)) ||
                    (pDVar4->id != TidyTag_BODY)))))) {
LAB_0013f761:
            pNVar9 = (node_00->root).prev;
            if ((((pNVar9 == (Node *)0x0) || (BVar6 = prvTidynodeHasCM(pNVar9,0x10), BVar6 != no))
                || (BVar6 = prvTidynodeIsElement((node_00->root).prev), BVar6 == no)) &&
               ((((node_00->root).prev != (Node *)0x0 ||
                 (pNVar9 = (node_00->root).parent, pNVar9->prev != (Node *)0x0)) ||
                (BVar6 = prvTidynodeHasCM(pNVar9->parent,0x10), BVar6 != no)))) goto LAB_0013f58a;
          }
          uVar8 = (node_00->root).start;
          while ((uVar8 < (node_00->root).end &&
                 (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar8]), BVar6 != no))) {
            uVar8 = (node_00->root).start + 1;
            (node_00->root).start = uVar8;
          }
        }
      }
LAB_0013f58a:
      BVar6 = prvTidynodeIsText(&node_00->root);
      if (((BVar6 != no) && (BVar6 = prvTidynodeIsText(&node_00->root), BVar6 != no)) &&
         (pNVar9 = (node_00->root).parent, pNVar12 = pNVar9, pNVar9->type != DocTypeTag)) {
        for (; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->parent) {
          if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->parser == prvTidyParsePre))
          goto LAB_0013f5b0;
        }
        if ((pNVar9->tag == (Dict *)0x0) || (pNVar9->tag->parser != prvTidyParseScript)) {
          pNVar12 = (node_00->root).next;
          if (pNVar12 == (Node *)0x0) {
            BVar6 = prvTidynodeHasCM(pNVar9,0x10);
            if ((BVar6 == no) ||
               ((pNVar9 = ((node_00->root).parent)->next, pNVar9 != (Node *)0x0 &&
                (BVar6 = prvTidynodeHasCM(pNVar9,0x10), BVar6 == no)))) goto LAB_0013f85a;
          }
          else if (((pNVar12->tag != (Dict *)0x0) &&
                   ((TVar2 = pNVar12->tag->id, TVar2 == TidyTag_BR ||
                    ((((TVar2 == TidyTag_SCRIPT && (pNVar12->parent != (Node *)0x0)) &&
                      (pDVar4 = pNVar12->parent->tag, pDVar4 != (Dict *)0x0)) &&
                     (pDVar4->id == TidyTag_BODY)))))) ||
                  ((BVar6 = prvTidynodeHasCM(pNVar12,0x10), BVar6 == no &&
                   (((pNVar12->type | CommentTag) == StartEndTag ||
                    (((BVar6 = prvTidynodeIsText(pNVar12), BVar6 != no &&
                      (pNVar12->start < pNVar12->end)) &&
                     (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[pNVar12->start]), BVar6 != no))
                    )))))) {
LAB_0013f85a:
            uVar8 = (node_00->root).end;
            while (((node_00->root).start < uVar8 &&
                   (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar8 - 1]), BVar6 != no))) {
              uVar8 = (node_00->root).end - 1;
              (node_00->root).end = uVar8;
            }
          }
        }
      }
LAB_0013f5b0:
      BVar6 = prvTidynodeIsText(&node_00->root);
      if ((BVar6 == no) || ((node_00->root).start < (node_00->root).end)) {
        if ((node_00->root).content == (Node *)0x0) goto LAB_0013f5f5;
        prvTidypush(stack,(Node *)node);
        node = (TidyDocImpl *)(node_00->root).content;
      }
      else {
        prvTidyRemoveNode(&node_00->root);
        prvTidyFreeNode(doc,&node_00->root);
LAB_0013f5f5:
        if (node == (TidyDocImpl *)0x0) {
          node = (TidyDocImpl *)prvTidypop(stack);
        }
      }
      node_00 = node;
    } while (node != (TidyDocImpl *)0x0);
  }
  prvTidyfreeStack(stack);
  if ((*(int *)((doc->config).value + 0x17) != 0) &&
     (pNVar9 = prvTidyFindBody(doc), pNVar9 != (Node *)0x0)) {
    pNVar9 = pNVar9->content;
    while (pNVar9 != (Node *)0x0) {
      BVar6 = prvTidynodeIsText(pNVar9);
      if (((BVar6 == no) || (BVar6 = prvTidyIsBlank(doc->lexer,pNVar9), BVar6 != no)) &&
         ((BVar6 = prvTidynodeIsElement(pNVar9), BVar6 == no ||
          (BVar6 = nodeCMIsOnlyInline(pNVar9), BVar6 == no)))) {
        pNVar9 = pNVar9->next;
      }
      else {
        pNVar13 = prvTidyInferredTag(doc,TidyTag_P);
        pNVar12 = pNVar9->parent;
        pNVar13->parent = pNVar12;
        pNVar13->next = pNVar9;
        pNVar13->prev = pNVar9->prev;
        pNVar9->prev = pNVar13;
        if (pNVar13->prev != (Node *)0x0) {
          pNVar13->prev->next = pNVar13;
        }
        if ((pNVar12 != (Node *)0x0) && (pNVar12->content == pNVar9)) {
          pNVar12->content = pNVar13;
        }
        pNVar12 = pNVar9;
        do {
          BVar6 = prvTidynodeIsElement(pNVar12);
          if ((BVar6 != no) && (BVar6 = nodeCMIsOnlyInline(pNVar12), pNVar9 = pNVar12, BVar6 == no))
          break;
          pNVar9 = pNVar12->next;
          prvTidyRemoveNode(pNVar12);
          pNVar12->parent = pNVar13;
          pNVar5 = pNVar13->last;
          pNVar12->prev = pNVar5;
          ppNVar11 = &pNVar5->next;
          if (pNVar5 == (Node *)0x0) {
            ppNVar11 = &pNVar13->content;
          }
          *ppNVar11 = pNVar12;
          pNVar13->last = pNVar12;
          pNVar12 = pNVar9;
        } while (pNVar9 != (Node *)0x0);
        TrimSpaces(doc,pNVar13);
      }
    }
  }
  if (*(int *)((doc->config).value + 0x16) != 0) {
    EncloseBlockText(doc,&doc->root);
    return;
  }
  return;
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only.
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc))
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
    }

    node = TY_(FindTITLE)(doc);
    if (!node)
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }
    else if (!node->content && !showingBodyOnly(doc))
    {
        /* Is #839 - warn node is blank in HTML5 */
        if (TY_(IsHTML5Mode)(doc))
        {
            TY_(Report)(doc, node, NULL, BLANK_TITLE_ELEMENT);
        }
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}